

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O0

void google::protobuf::MapTestUtil::SetMapFields<proto2_unittest::TestMap>(TestMap *message)

{
  MapEnum MVar1;
  Map<int,_int> *pMVar2;
  int *piVar3;
  Map<long,_long> *pMVar4;
  long *plVar5;
  Map<unsigned_int,_unsigned_int> *pMVar6;
  uint *puVar7;
  Map<unsigned_long,_unsigned_long> *pMVar8;
  unsigned_long *puVar9;
  Map<int,_float> *pMVar10;
  float *pfVar11;
  Map<int,_double> *pMVar12;
  double *pdVar13;
  Map<bool,_bool> *pMVar14;
  bool *pbVar15;
  Map<std::__cxx11::string,std::__cxx11::string> *pMVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar18;
  Map<int,_proto2_unittest::MapEnum> *pMVar19;
  MapEnum *pMVar20;
  Map<int,_proto2_unittest::ForeignMessage> *pMVar21;
  ForeignMessage *pFVar22;
  key_arg<int> local_1b4;
  key_arg<int> local_1b0;
  key_arg<int> local_1ac;
  string local_1a8 [32];
  key_arg<std::__cxx11::basic_string<char>_> local_188;
  string local_168 [39];
  key_arg<bool> local_141;
  key_arg<int> local_140;
  key_arg<int> local_13c;
  key_arg<long> local_138;
  key_arg<int> local_12c;
  key_arg<unsigned_long> local_128;
  key_arg<unsigned_int> local_11c;
  key_arg<long> local_118;
  key_arg<int> local_10c;
  key_arg<unsigned_long> local_108;
  key_arg<unsigned_int> local_fc;
  key_arg<long> local_f8;
  key_arg<int> local_f0;
  key_arg<int> local_ec;
  key_arg<int> local_e8;
  key_arg<int> local_e4;
  string local_e0 [32];
  key_arg<std::__cxx11::basic_string<char>_> local_c0;
  string local_90 [39];
  key_arg<bool> local_69;
  key_arg<int> local_68;
  key_arg<int> local_64;
  key_arg<long> local_60;
  key_arg<int> local_54;
  key_arg<unsigned_long> local_50;
  key_arg<unsigned_int> local_44;
  key_arg<long> local_40;
  key_arg<int> local_34;
  key_arg<unsigned_long> local_30;
  key_arg<unsigned_int> local_24;
  key_arg<long> local_20;
  key_arg<int> local_14;
  TestMap *local_10;
  TestMap *message_local;
  
  local_10 = message;
  pMVar2 = proto2_unittest::TestMap::mutable_map_int32_int32(message);
  local_14 = 0;
  piVar3 = Map<int,_int>::operator[]<int>(pMVar2,&local_14);
  *piVar3 = 0;
  pMVar4 = proto2_unittest::TestMap::mutable_map_int64_int64(local_10);
  local_20 = 0;
  plVar5 = Map<long,_long>::operator[]<long>(pMVar4,&local_20);
  *plVar5 = 0;
  pMVar6 = proto2_unittest::TestMap::mutable_map_uint32_uint32(local_10);
  local_24 = 0;
  puVar7 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>(pMVar6,&local_24);
  *puVar7 = 0;
  pMVar8 = proto2_unittest::TestMap::mutable_map_uint64_uint64(local_10);
  local_30 = 0;
  puVar9 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar8,&local_30);
  *puVar9 = 0;
  pMVar2 = proto2_unittest::TestMap::mutable_map_sint32_sint32(local_10);
  local_34 = 0;
  piVar3 = Map<int,_int>::operator[]<int>(pMVar2,&local_34);
  *piVar3 = 0;
  pMVar4 = proto2_unittest::TestMap::mutable_map_sint64_sint64(local_10);
  local_40 = 0;
  plVar5 = Map<long,_long>::operator[]<long>(pMVar4,&local_40);
  *plVar5 = 0;
  pMVar6 = proto2_unittest::TestMap::mutable_map_fixed32_fixed32(local_10);
  local_44 = 0;
  puVar7 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>(pMVar6,&local_44);
  *puVar7 = 0;
  pMVar8 = proto2_unittest::TestMap::mutable_map_fixed64_fixed64(local_10);
  local_50 = 0;
  puVar9 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar8,&local_50);
  *puVar9 = 0;
  pMVar2 = proto2_unittest::TestMap::mutable_map_sfixed32_sfixed32(local_10);
  local_54 = 0;
  piVar3 = Map<int,_int>::operator[]<int>(pMVar2,&local_54);
  *piVar3 = 0;
  pMVar4 = proto2_unittest::TestMap::mutable_map_sfixed64_sfixed64(local_10);
  local_60 = 0;
  plVar5 = Map<long,_long>::operator[]<long>(pMVar4,&local_60);
  *plVar5 = 0;
  pMVar10 = proto2_unittest::TestMap::mutable_map_int32_float(local_10);
  local_64 = 0;
  pfVar11 = Map<int,_float>::operator[]<int>(pMVar10,&local_64);
  *pfVar11 = 0.0;
  pMVar12 = proto2_unittest::TestMap::mutable_map_int32_double(local_10);
  local_68 = 0;
  pdVar13 = Map<int,_double>::operator[]<int>(pMVar12,&local_68);
  *pdVar13 = 0.0;
  pMVar14 = proto2_unittest::TestMap::mutable_map_bool_bool(local_10);
  local_69 = false;
  pbVar15 = Map<bool,_bool>::operator[]<bool>(pMVar14,&local_69);
  *pbVar15 = false;
  long_string_abi_cxx11_();
  pMVar16 = (Map<std::__cxx11::string,std::__cxx11::string> *)
            proto2_unittest::TestMap::mutable_map_string_string_abi_cxx11_(local_10);
  long_string_abi_cxx11_();
  pbVar17 = Map<std::__cxx11::string,std::__cxx11::string>::operator[]<std::__cxx11::string,void>
                      (pMVar16,&local_c0);
  std::__cxx11::string::operator=((string *)pbVar17,local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string(local_90);
  long_string_abi_cxx11_();
  pMVar18 = proto2_unittest::TestMap::mutable_map_int32_bytes_abi_cxx11_(local_10);
  local_e4 = 0;
  pbVar17 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[]<int>(pMVar18,&local_e4);
  std::__cxx11::string::operator=((string *)pbVar17,local_e0);
  std::__cxx11::string::~string(local_e0);
  MVar1 = MapEnum_BAR<proto2_unittest::TestMap>();
  pMVar19 = proto2_unittest::TestMap::mutable_map_int32_enum(local_10);
  local_e8 = 0;
  pMVar20 = Map<int,_proto2_unittest::MapEnum>::operator[]<int>(pMVar19,&local_e8);
  *pMVar20 = MVar1;
  pMVar21 = proto2_unittest::TestMap::mutable_map_int32_foreign_message(local_10);
  local_ec = 0;
  pFVar22 = Map<int,_proto2_unittest::ForeignMessage>::operator[]<int>(pMVar21,&local_ec);
  proto2_unittest::ForeignMessage::set_c(pFVar22,0);
  pMVar2 = proto2_unittest::TestMap::mutable_map_int32_int32(local_10);
  local_f0 = 1;
  piVar3 = Map<int,_int>::operator[]<int>(pMVar2,&local_f0);
  *piVar3 = 1;
  pMVar4 = proto2_unittest::TestMap::mutable_map_int64_int64(local_10);
  local_f8 = 1;
  plVar5 = Map<long,_long>::operator[]<long>(pMVar4,&local_f8);
  *plVar5 = 1;
  pMVar6 = proto2_unittest::TestMap::mutable_map_uint32_uint32(local_10);
  local_fc = 1;
  puVar7 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>(pMVar6,&local_fc);
  *puVar7 = 1;
  pMVar8 = proto2_unittest::TestMap::mutable_map_uint64_uint64(local_10);
  local_108 = 1;
  puVar9 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar8,&local_108);
  *puVar9 = 1;
  pMVar2 = proto2_unittest::TestMap::mutable_map_sint32_sint32(local_10);
  local_10c = 1;
  piVar3 = Map<int,_int>::operator[]<int>(pMVar2,&local_10c);
  *piVar3 = 1;
  pMVar4 = proto2_unittest::TestMap::mutable_map_sint64_sint64(local_10);
  local_118 = 1;
  plVar5 = Map<long,_long>::operator[]<long>(pMVar4,&local_118);
  *plVar5 = 1;
  pMVar6 = proto2_unittest::TestMap::mutable_map_fixed32_fixed32(local_10);
  local_11c = 1;
  puVar7 = Map<unsigned_int,_unsigned_int>::operator[]<unsigned_int>(pMVar6,&local_11c);
  *puVar7 = 1;
  pMVar8 = proto2_unittest::TestMap::mutable_map_fixed64_fixed64(local_10);
  local_128 = 1;
  puVar9 = Map<unsigned_long,_unsigned_long>::operator[]<unsigned_long>(pMVar8,&local_128);
  *puVar9 = 1;
  pMVar2 = proto2_unittest::TestMap::mutable_map_sfixed32_sfixed32(local_10);
  local_12c = 1;
  piVar3 = Map<int,_int>::operator[]<int>(pMVar2,&local_12c);
  *piVar3 = 1;
  pMVar4 = proto2_unittest::TestMap::mutable_map_sfixed64_sfixed64(local_10);
  local_138 = 1;
  plVar5 = Map<long,_long>::operator[]<long>(pMVar4,&local_138);
  *plVar5 = 1;
  pMVar10 = proto2_unittest::TestMap::mutable_map_int32_float(local_10);
  local_13c = 1;
  pfVar11 = Map<int,_float>::operator[]<int>(pMVar10,&local_13c);
  *pfVar11 = 1.0;
  pMVar12 = proto2_unittest::TestMap::mutable_map_int32_double(local_10);
  local_140 = 1;
  pdVar13 = Map<int,_double>::operator[]<int>(pMVar12,&local_140);
  *pdVar13 = 1.0;
  pMVar14 = proto2_unittest::TestMap::mutable_map_bool_bool(local_10);
  local_141 = true;
  pbVar15 = Map<bool,_bool>::operator[]<bool>(pMVar14,&local_141);
  *pbVar15 = true;
  long_string_2_abi_cxx11_();
  pMVar16 = (Map<std::__cxx11::string,std::__cxx11::string> *)
            proto2_unittest::TestMap::mutable_map_string_string_abi_cxx11_(local_10);
  long_string_2_abi_cxx11_();
  pbVar17 = Map<std::__cxx11::string,std::__cxx11::string>::operator[]<std::__cxx11::string,void>
                      (pMVar16,&local_188);
  std::__cxx11::string::operator=((string *)pbVar17,local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string(local_168);
  long_string_2_abi_cxx11_();
  pMVar18 = proto2_unittest::TestMap::mutable_map_int32_bytes_abi_cxx11_(local_10);
  local_1ac = 1;
  pbVar17 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[]<int>(pMVar18,&local_1ac);
  std::__cxx11::string::operator=((string *)pbVar17,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  MVar1 = MapEnum_BAZ<proto2_unittest::TestMap>();
  pMVar19 = proto2_unittest::TestMap::mutable_map_int32_enum(local_10);
  local_1b0 = 1;
  pMVar20 = Map<int,_proto2_unittest::MapEnum>::operator[]<int>(pMVar19,&local_1b0);
  *pMVar20 = MVar1;
  pMVar21 = proto2_unittest::TestMap::mutable_map_int32_foreign_message(local_10);
  local_1b4 = 1;
  pFVar22 = Map<int,_proto2_unittest::ForeignMessage>::operator[]<int>(pMVar21,&local_1b4);
  proto2_unittest::ForeignMessage::set_c(pFVar22,1);
  return;
}

Assistant:

void MapTestUtil::SetMapFields(TestMap* message) {
  // Add first element.
  (*message->mutable_map_int32_int32())[0] = 0;
  (*message->mutable_map_int64_int64())[0] = 0;
  (*message->mutable_map_uint32_uint32())[0] = 0;
  (*message->mutable_map_uint64_uint64())[0] = 0;
  (*message->mutable_map_sint32_sint32())[0] = 0;
  (*message->mutable_map_sint64_sint64())[0] = 0;
  (*message->mutable_map_fixed32_fixed32())[0] = 0;
  (*message->mutable_map_fixed64_fixed64())[0] = 0;
  (*message->mutable_map_sfixed32_sfixed32())[0] = 0;
  (*message->mutable_map_sfixed64_sfixed64())[0] = 0;
  (*message->mutable_map_int32_float())[0] = 0.0;
  (*message->mutable_map_int32_double())[0] = 0.0;
  (*message->mutable_map_bool_bool())[0] = false;
  (*message->mutable_map_string_string())[long_string()] = long_string();
  (*message->mutable_map_int32_bytes())[0] = long_string();
  (*message->mutable_map_int32_enum())[0] = MapEnum_BAR<TestMap>();
  (*message->mutable_map_int32_foreign_message())[0].set_c(0);

  // Add second element
  (*message->mutable_map_int32_int32())[1] = 1;
  (*message->mutable_map_int64_int64())[1] = 1;
  (*message->mutable_map_uint32_uint32())[1] = 1;
  (*message->mutable_map_uint64_uint64())[1] = 1;
  (*message->mutable_map_sint32_sint32())[1] = 1;
  (*message->mutable_map_sint64_sint64())[1] = 1;
  (*message->mutable_map_fixed32_fixed32())[1] = 1;
  (*message->mutable_map_fixed64_fixed64())[1] = 1;
  (*message->mutable_map_sfixed32_sfixed32())[1] = 1;
  (*message->mutable_map_sfixed64_sfixed64())[1] = 1;
  (*message->mutable_map_int32_float())[1] = 1.0;
  (*message->mutable_map_int32_double())[1] = 1.0;
  (*message->mutable_map_bool_bool())[1] = true;
  (*message->mutable_map_string_string())[long_string_2()] = long_string_2();
  (*message->mutable_map_int32_bytes())[1] = long_string_2();
  (*message->mutable_map_int32_enum())[1] = MapEnum_BAZ<TestMap>();
  (*message->mutable_map_int32_foreign_message())[1].set_c(1);
}